

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O2

void __thiscall QPdf::ByteStream::prepareBuffer(ByteStream *this)

{
  char cVar1;
  long lVar2;
  QTemporaryFile *this_00;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (**(code **)(*(long *)this->dev + 0x80))();
  if (((this->fileBackingEnabled == true) && (100000000 < lVar2)) &&
     (this->fileBackingActive == false)) {
    this_00 = (QTemporaryFile *)operator_new(0x10);
    QTemporaryFile::QTemporaryFile(this_00);
    cVar1 = (**(code **)(*(long *)this_00 + 0x68))(this_00,3);
    if (cVar1 != '\0') {
      (**(code **)(*(long *)this->dev + 0x98))();
      while( true ) {
        cVar1 = (**(code **)(*(long *)this->dev + 0x90))();
        if (cVar1 != '\0') break;
        local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QIODevice::read((longlong)&local_48);
        QIODevice::write((QByteArray *)this_00);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
      }
      if (this->dev != (QIODevice *)0x0) {
        (**(code **)(*(long *)this->dev + 0x20))();
      }
      this->dev = (QIODevice *)this_00;
      QByteArray::clear();
      this->fileBackingActive = true;
    }
  }
  lVar3 = (**(code **)(*(long *)this->dev + 0x78))();
  if (lVar3 != lVar2) {
    (**(code **)(*(long *)this->dev + 0x88))(this->dev,lVar2);
    this->handleDirty = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ByteStream::prepareBuffer()
    {
        Q_ASSERT(!dev->isSequential());
        qint64 size = dev->size();
        if (fileBackingEnabled && !fileBackingActive
                && size > maxMemorySize()) {
            // Switch to file backing.
            QTemporaryFile *newFile = new QTemporaryFile;
            if (newFile->open()) {
                dev->reset();
                while (!dev->atEnd()) {
                    QByteArray buf = dev->read(chunkSize());
                    newFile->write(buf);
                }
                delete dev;
                dev = newFile;
                ba.clear();
                fileBackingActive = true;
            }
        }
        if (dev->pos() != size) {
            dev->seek(size);
            handleDirty = false;
        }
    }